

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

bool P_Thing_Spawn(int tid,AActor *source,int type,DAngle *angle,bool fog,int newtid)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  PClassActor *this;
  AActor *mobj;
  Angle *pAVar5;
  AActor **ppAVar6;
  AActor *pAVar7;
  DVector3 local_58;
  Angle *local_40;
  PClassActor *local_38;
  
  local_40 = angle;
  this = P_GetSpawnableType(type);
  if ((this == (PClassActor *)0x0) ||
     ((local_38 = PClassActor::GetReplacement(this,true),
      ((local_38->super_PClass).Defaults[0x1c5] & 0x20) != 0 &&
      ((level.flags2 & 0x8000) != 0 || (dmflags.Value & 0x1000U) != 0)))) {
    bVar3 = false;
  }
  else {
    if (tid == 0) {
      pAVar7 = (AActor *)0x0;
    }
    else {
      for (pAVar7 = AActor::TIDHash[tid & 0x7f];
          (source = pAVar7, pAVar7 != (AActor *)0x0 && (pAVar7->tid != tid)); pAVar7 = pAVar7->inext
          ) {
      }
    }
    bVar3 = false;
    if (source != (AActor *)0x0) {
      iVar4 = 0;
      do {
        local_58.X = (source->__Pos).X;
        local_58.Y = (source->__Pos).Y;
        local_58.Z = (source->__Pos).Z;
        mobj = AActor::StaticSpawn(local_38,&local_58,ALLOW_REPLACE,false);
        if (mobj != (AActor *)0x0) {
          uVar1 = (mobj->flags2).Value;
          (mobj->flags2).Value = uVar1 | 0x1000;
          bVar3 = P_TestMobjLocation(mobj);
          if (bVar3) {
            pAVar5 = &(source->Angles).Yaw;
            if (local_40->Degrees != 1000000.0) {
              pAVar5 = local_40;
            }
            if (NAN(local_40->Degrees)) {
              pAVar5 = local_40;
            }
            (mobj->Angles).Yaw.Degrees = pAVar5->Degrees;
            if (fog) {
              local_58.X = (source->__Pos).X;
              local_58.Y = (source->__Pos).Y;
              local_58.Z = (source->__Pos).Z;
              P_SpawnTeleportFog(mobj,&local_58,false,true);
            }
            uVar2 = (mobj->flags).Value;
            if ((uVar2 & 1) != 0) {
              (mobj->flags).Value = uVar2 | 0x20000;
            }
            iVar4 = iVar4 + 1;
            mobj->tid = newtid;
            AActor::AddToHash(mobj);
            (mobj->flags2).Value = uVar1;
          }
          else {
            AActor::ClearCounters(mobj);
            (*(mobj->super_DThinker).super_DObject._vptr_DObject[4])(mobj);
          }
        }
        if (tid == 0) {
          source = (AActor *)0x0;
        }
        else {
          ppAVar6 = &pAVar7->inext;
          if (pAVar7 == (AActor *)0x0) {
            ppAVar6 = (AActor **)((long)AActor::TIDHash + (ulong)((tid & 0x7fU) << 3));
          }
          for (pAVar7 = *ppAVar6; (source = pAVar7, pAVar7 != (AActor *)0x0 && (pAVar7->tid != tid))
              ; pAVar7 = pAVar7->inext) {
          }
        }
      } while (source != (AActor *)0x0);
      bVar3 = iVar4 != 0;
    }
  }
  return bVar3;
}

Assistant:

bool P_Thing_Spawn (int tid, AActor *source, int type, DAngle angle, bool fog, int newtid)
{
	int rtn = 0;
	PClassActor *kind;
	AActor *spot, *mobj;
	FActorIterator iterator (tid);

	kind = P_GetSpawnableType(type);

	if (kind == NULL)
		return false;

	// Handle decorate replacements.
	kind = kind->GetReplacement();

	if ((GetDefaultByType(kind)->flags3 & MF3_ISMONSTER) && 
		((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		return false;

	if (tid == 0)
	{
		spot = source;
	}
	else
	{
		spot = iterator.Next();
	}
	while (spot != NULL)
	{
		mobj = Spawn (kind, spot->Pos(), ALLOW_REPLACE);

		if (mobj != NULL)
		{
			ActorFlags2 oldFlags2 = mobj->flags2;
			mobj->flags2 |= MF2_PASSMOBJ;
			if (P_TestMobjLocation (mobj))
			{
				rtn++;
				mobj->Angles.Yaw = (angle != 1000000. ? angle : spot->Angles.Yaw);
				if (fog)
				{
					P_SpawnTeleportFog(mobj, spot->Pos(), false, true);
				}
				if (mobj->flags & MF_SPECIAL)
					mobj->flags |= MF_DROPPED;	// Don't respawn
				mobj->tid = newtid;
				mobj->AddToHash ();
				mobj->flags2 = oldFlags2;
			}
			else
			{
				// If this is a monster, subtract it from the total monster
				// count, because it already added to it during spawning.
				mobj->ClearCounters();
				mobj->Destroy ();
			}
		}
		spot = iterator.Next();
	}

	return rtn != 0;
}